

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<SchemeFilePort> sVar1;
  __allocator_type __a2;
  __shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_istream<char,_std::char_traits<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kalinochkind[P]scheme_src_schemeobject_cpp:330:64),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  local_40._M_alloc =
       (allocator<std::_Sp_counted_deleter<std::basic_istream<char,_std::char_traits<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kalinochkind[P]scheme_src_schemeobject_cpp:330:64),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
        *)CONCAT44(local_40._M_alloc._4_4_,2);
  std::make_shared<SchemeFilePort,port_type_t>((port_type_t *)in_RDI);
  local_50._M_ptr = (element_type *)&std::cin;
  local_50._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_50._M_refcount._M_pi)->_M_use_count = 1;
  (local_50._M_refcount._M_pi)->_M_weak_count = 1;
  (local_50._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_00165c38;
  local_50._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&std::cin;
  local_40._M_ptr = (pointer)0x0;
  local_40._M_alloc = &__a2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_istream<char,_std::char_traits<char>_>_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/schemeobject.cpp:330:64),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)((in_RDI->super_SchemePort).super_SchemeObject._vptr_SchemeObject + 2),&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  local_50._M_ptr = (element_type *)&std::cout;
  local_50._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_50._M_refcount._M_pi)->_M_use_count = 1;
  (local_50._M_refcount._M_pi)->_M_weak_count = 1;
  (local_50._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_base_00165c98;
  local_50._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&std::cout;
  local_40._M_ptr = (pointer)0x0;
  local_40._M_alloc = &__a2;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_ostream<char,_std::char_traits<char>_>_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kalinochkind[P]scheme/src/schemeobject.cpp:331:66),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::basic_ostream<char,_std::char_traits<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kalinochkind[P]scheme_src_schemeobject_cpp:331:66),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_40);
  std::__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)((in_RDI->super_SchemePort).super_SchemeObject._vptr_SchemeObject + 4),
            (__shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  sVar1.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<SchemeFilePort>)
         sVar1.super___shared_ptr<SchemeFilePort,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeFilePort> SchemeFilePort::create_default_port()
{
    auto p = std::make_shared<SchemeFilePort>(port_type_t::IO);
    p->input_stream = std::shared_ptr<std::istream>(&std::cin, [](void*){});
    p->output_stream = std::shared_ptr<std::ostream>(&std::cout, [](void*){});
    return p;
}